

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_point_3d * mg_point_3d_make(uint16_t srid,double x_longitude,double y_latitude,double z_height)

{
  ushort in_DI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  mg_allocator *in_XMM2_Qa;
  mg_point_3d *point;
  mg_point_3d *local_8;
  
  local_8 = mg_point_3d_alloc(in_XMM2_Qa);
  if (local_8 == (mg_point_3d *)0x0) {
    local_8 = (mg_point_3d *)0x0;
  }
  else {
    local_8->srid = (ulong)in_DI;
    local_8->x = in_XMM0_Qa;
    local_8->y = in_XMM1_Qa;
    local_8->z = (double)in_XMM2_Qa;
  }
  return local_8;
}

Assistant:

mg_point_3d *mg_point_3d_make(uint16_t srid, double x_longitude,
                              double y_latitude, double z_height) {
  mg_point_3d *point = mg_point_3d_alloc(&mg_system_allocator);
  if (!point) {
    return NULL;
  }
  point->srid = srid;
  point->x = x_longitude;
  point->y = y_latitude;
  point->z = z_height;
  ;
  return point;
}